

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O2

void __thiscall
sc_core::sc_module_dynalloc_list::~sc_module_dynalloc_list(sc_module_dynalloc_list *this)

{
  bool bVar1;
  void *pvVar2;
  long *plVar3;
  iterator it;
  sc_plist_base_iter local_20;
  
  sc_plist_base_iter::sc_plist_base_iter(&local_20,(sc_plist_base *)this,false);
  while( true ) {
    bVar1 = sc_plist_base_iter::empty(&local_20);
    if (bVar1) break;
    pvVar2 = sc_plist_base_iter::get(&local_20);
    *(undefined8 *)((long)pvVar2 + 0x60) = 0;
    plVar3 = (long *)sc_plist_base_iter::get(&local_20);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x38))(plVar3);
    }
    sc_plist_base_iter::operator++(&local_20,0);
  }
  sc_plist_base_iter::~sc_plist_base_iter(&local_20);
  sc_plist_base::~sc_plist_base((sc_plist_base *)this);
  return;
}

Assistant:

sc_module_dynalloc_list::~sc_module_dynalloc_list()
{
    sc_plist<sc_module*>::iterator it( m_list );
    while( ! it.empty() ) {
        (*it)->m_parent = 0;
        delete *it;
        it ++;
    }
}